

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O0

void es5503_pcm_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  byte bVar7;
  int resshift_00;
  uint uVar8;
  int iVar9;
  ushort *puVar10;
  int local_64;
  INT32 outData;
  int mode;
  UINT32 sizemask;
  int resshift;
  UINT8 chnMask;
  UINT16 wtsize;
  UINT32 altram;
  UINT32 wtptr;
  ES5503Osc *pOsc;
  UINT8 chan;
  UINT8 chnsStereo;
  ES5503Chip *chip;
  uint local_28;
  UINT32 ramptr;
  UINT32 snum;
  UINT8 osc;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  if (*(long *)((long)param + 0x10) != 0) {
    bVar1 = *(byte *)((long)param + 0x340);
    for (local_28 = 0; local_28 < samples; local_28 = local_28 + 1) {
      for (ramptr._3_1_ = 0; ramptr._3_1_ < *(byte *)((long)param + 0x338);
          ramptr._3_1_ = ramptr._3_1_ + 1) {
        puVar10 = (ushort *)((long)param + (ulong)ramptr._3_1_ * 0x18 + 0x38);
        if (((puVar10[2] & 1) == 0) && (*(char *)((long)puVar10 + 0x15) == '\0')) {
          uVar3 = *(uint *)(puVar10 + 4);
          uVar4 = wavemasks[(byte)puVar10[6]];
          uVar2 = puVar10[1];
          resshift_00 = resshifts[*(byte *)((long)puVar10 + 0xd)] - (uint)(byte)puVar10[6];
          uVar5 = accmasks[(byte)puVar10[6]];
          uVar6 = puVar10[2];
          bVar7 = (byte)((int)(uint)(byte)puVar10[2] >> 4) & *(byte *)((long)param + 0x341);
          uVar8 = *(uint *)(puVar10 + 8) >> ((byte)resshift_00 & 0x1f);
          *(uint *)(puVar10 + 8) = (uint)*puVar10 + *(int *)(puVar10 + 8);
          *(char *)((long)param + 0x33a) = (char)((int)(uint)(byte)puVar10[2] >> 4);
          *(undefined1 *)(puVar10 + 3) =
               *(undefined1 *)
                (*(long *)((long)param + 0x10) + (ulong)((uVar8 & uVar5) + (uVar3 & uVar4)));
          if ((char)puVar10[3] == '\0') {
            es5503_halt_osc((ES5503Chip *)param,(uint)ramptr._3_1_,1,(UINT32 *)(puVar10 + 8),
                            resshift_00);
          }
          else {
            if (((int)(uint)(byte)uVar6 >> 1 & 3U) == 2) {
              if ((ramptr._3_1_ & 1) == 0) {
                local_64 = ((byte)puVar10[3] - 0x80) *
                           (int)(short)(ushort)*(byte *)((long)puVar10 + 5);
              }
              else {
                if ((ramptr._3_1_ < 0x1f) &&
                   ((*(byte *)((long)param + (long)(int)(ramptr._3_1_ + 1) * 0x18 + 0x3c) & 1) == 0)
                   ) {
                  *(char *)((long)param + (long)(int)(ramptr._3_1_ + 1) * 0x18 + 0x3d) =
                       (char)puVar10[3];
                }
                local_64 = 0;
              }
            }
            else {
              local_64 = ((byte)puVar10[3] - 0x80) *
                         (int)(short)(ushort)*(byte *)((long)puVar10 + 5);
            }
            for (pOsc._6_1_ = 0; pOsc._6_1_ < (bVar1 & 0xfe); pOsc._6_1_ = pOsc._6_1_ + 1) {
              if (pOsc._6_1_ == bVar7) {
                outputs[(int)(pOsc._6_1_ & 1)][local_28] =
                     local_64 + outputs[(int)(pOsc._6_1_ & 1)][local_28];
              }
            }
            iVar9 = local_64 * 0xb5 >> 8;
            for (; pOsc._6_1_ < *(byte *)((long)param + 0x340); pOsc._6_1_ = pOsc._6_1_ + 1) {
              if (pOsc._6_1_ == bVar7) {
                (*outputs)[local_28] = iVar9 + (*outputs)[local_28];
                outputs[1][local_28] = iVar9 + outputs[1][local_28];
              }
            }
            if ((ushort)(uVar2 - 1) <= uVar8) {
              es5503_halt_osc((ES5503Chip *)param,(uint)ramptr._3_1_,0,(UINT32 *)(puVar10 + 8),
                              resshift_00);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void es5503_pcm_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	UINT8 osc;
	UINT32 snum;
	UINT32 ramptr;
	ES5503Chip *chip = (ES5503Chip *)param;
	UINT8 chnsStereo, chan;

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (chip->docram == NULL)
		return;

	chnsStereo = chip->output_channels & ~1;
	for (snum = 0; snum < samples; snum++)
	{
		for (osc = 0; osc < chip->oscsenabled; osc++)
		{
			ES5503Osc *pOsc = &chip->oscillators[osc];

			if (!(pOsc->control & 1) && ! pOsc->Muted)
			{
				UINT32 wtptr = pOsc->wavetblpointer & wavemasks[pOsc->wavetblsize];
				UINT32 altram;
				UINT16 wtsize = pOsc->wtsize - 1;
				UINT8 chnMask = (pOsc->control >> 4) & 0x0F;
				int resshift = resshifts[pOsc->resolution] - pOsc->wavetblsize;
				UINT32 sizemask = accmasks[pOsc->wavetblsize];
				const int mode = (pOsc->control>>1) & 3;

				chnMask &= chip->outchn_mask;
				altram = pOsc->accumulator >> resshift;
				ramptr = altram & sizemask;

				pOsc->accumulator += pOsc->freq;

				// channel strobe is always valid when reading; this allows potentially banking per voice
				chip->channel_strobe = (pOsc->control>>4) & 0xf;
				pOsc->data = chip->docram[ramptr + wtptr];

				if (pOsc->data == 0x00)
				{
					es5503_halt_osc(chip, osc, 1, &pOsc->accumulator, resshift);
				}
				else
				{
					INT32 outData;
					if (mode != MODE_SYNCAM)
					{
						outData = (pOsc->data - 0x80) * (INT16)pOsc->vol;
					}
					else
					{
						// if we're odd, we play nothing ourselves
						if (osc & 1)
						{
							if (osc < 31)
							{
								// if the next oscillator up is playing, it's volume becomes our control
								if (!(chip->oscillators[osc + 1].control & 1))
								{
									chip->oscillators[osc + 1].vol = pOsc->data;
								}
							}
							outData = 0;
						}
						else    // hard sync, both oscillators play?
						{
							outData = (pOsc->data - 0x80) * (INT16)pOsc->vol;
						}
					}

					// send groups of 2 channels to L or R
					for (chan = 0; chan < chnsStereo; chan ++)
					{
						if (chan == chnMask)
							outputs[chan & 1][snum] += outData;
					}
					outData = (outData * 181) >> 8;	// outData *= sqrt(2)
					// send remaining channels to L+R
					for (; chan < chip->output_channels; chan ++)
					{
						if (chan == chnMask)
						{
							outputs[0][snum] += outData;
							outputs[1][snum] += outData;
						}
					}

					if (altram >= wtsize)
					{
						es5503_halt_osc(chip, osc, 0, &pOsc->accumulator, resshift);
					}
				}
			}	// end if (oscillators[osc] playing)
		}	// end for (osc)
	}	// end for (snum)
}